

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O1

void __thiscall
glcts::LayoutBindingBaseCase::setArg(LayoutBindingBaseCase *this,String *arg,String *value)

{
  long *plVar1;
  ulong *puVar2;
  ulong *local_60;
  long local_58;
  ulong local_50;
  long lStack_48;
  ulong *local_40 [2];
  ulong local_30 [2];
  
  if (value->_M_string_length == 0) {
    local_58 = 0;
    local_50 = local_50 & 0xffffffffffffff00;
    local_60 = &local_50;
    std::__cxx11::string::operator=((string *)arg,(string *)&local_60);
    local_30[0] = local_50;
    puVar2 = local_60;
    if (local_60 == &local_50) {
      return;
    }
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40," ","");
    plVar1 = (long *)std::__cxx11::string::replace
                               ((ulong)local_40,0,(char *)0x0,(ulong)(value->_M_dataplus)._M_p);
    puVar2 = (ulong *)(plVar1 + 2);
    if ((ulong *)*plVar1 == puVar2) {
      local_50 = *puVar2;
      lStack_48 = plVar1[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *puVar2;
      local_60 = (ulong *)*plVar1;
    }
    local_58 = plVar1[1];
    *plVar1 = (long)puVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)arg,(string *)&local_60);
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
    }
    puVar2 = local_40[0];
    if (local_40[0] == local_30) {
      return;
    }
  }
  operator_delete(puVar2,local_30[0] + 1);
  return;
}

Assistant:

void setArg(String& arg, const String& value) const
	{
		if (!value.empty())
			arg = value + String(" ");
		else
			arg = String();
	}